

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> __thiscall
anon_unknown.dwarf_3261e3::LocalFileSystem::getFileContents(LocalFileSystem *this,string *path)

{
  undefined8 uVar1;
  string *in_RDX;
  pointer *__ptr;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> result;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  local_48;
  byte local_38;
  Twine local_30;
  
  llvm::Twine::Twine(&local_30,in_RDX);
  llvm::MemoryBuffer::getFile
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)&local_48.TStorage,&local_30,-1,true,false);
  uVar1 = local_48.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer;
  if (((local_38 & 1) == 0) || (local_48._0_4_ == 0)) {
    if ((local_38 & 1) != 0) {
      __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/ErrorOr.h"
                    ,0xf4,
                    "storage_type *llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer>>::getStorage() [T = std::unique_ptr<llvm::MemoryBuffer>]"
                   );
    }
    local_48.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
         (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
          )(AlignedCharArray<8UL,_8UL>)0x0;
  }
  else {
    (this->super_FileSystem)._vptr_FileSystem = (_func_int **)0x0;
    uVar1._0_1_ = '\0';
    uVar1._1_1_ = '\0';
    uVar1._2_1_ = '\0';
    uVar1._3_1_ = '\0';
    uVar1._4_1_ = '\0';
    uVar1._5_1_ = '\0';
    uVar1._6_1_ = '\0';
    uVar1._7_1_ = '\0';
  }
  (this->super_FileSystem)._vptr_FileSystem = (_func_int **)uVar1;
  if (((local_38 & 1) == 0) &&
     (local_48.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer != (AlignedCharArray<8UL,_8UL>)0x0))
  {
    (**(code **)(*(_func_int **)local_48.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))();
  }
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         this;
}

Assistant:

virtual std::unique_ptr<llvm::MemoryBuffer>
  getFileContents(const std::string& path) override {
    auto result = llvm::MemoryBuffer::getFile(path);
    if (result.getError()) {
      return nullptr;
    }
    return std::unique_ptr<llvm::MemoryBuffer>(result->release());
  }